

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollController.cpp
# Opt level: O2

void __thiscall Rml::ScrollController::UpdateSmoothscroll(ScrollController *this,float dp_ratio)

{
  code *pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  int i;
  long lVar5;
  Vector2f VVar12;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Vector2f VVar11;
  Vector2<float> VVar13;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar14 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar15 [16];
  float local_b8;
  float fStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  Vector2f scroll_distance;
  float local_98;
  float fStack_94;
  float local_88;
  float fStack_84;
  undefined1 local_68 [24];
  Vector2f target_delta;
  Vector2<float> local_20;
  
  if (((this->mode != Smoothscroll) || (this->target == (Element *)0x0)) &&
     (bVar4 = Assert("RMLUI_ASSERT(mode == Mode::Smoothscroll && target)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ScrollController.cpp"
                     ,0xa0), !bVar4)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  VVar11 = this->smoothscroll_scrolled_distance;
  local_68._0_4_ = (this->smoothscroll_target_distance).x - VVar11.x;
  local_68._4_4_ = (this->smoothscroll_target_distance).y - VVar11.y;
  local_68._8_8_ = 0;
  target_delta.y = (float)local_68._4_4_;
  target_delta.x = (float)local_68._0_4_;
  VVar11 = Math::Absolute(VVar11);
  uStack_b0 = (undefined4)extraout_XMM0_Qb;
  uStack_ac = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
  auVar14._4_4_ = dp_ratio;
  auVar14._0_4_ = dp_ratio;
  auVar14._8_4_ = dp_ratio;
  auVar14._12_4_ = dp_ratio;
  auVar14 = divps(local_68._0_16_,auVar14);
  VVar12 = Math::Absolute(auVar14._0_8_);
  local_88 = VVar12.x;
  fStack_84 = VVar12.y;
  Tween::Tween((Tween *)&scroll_distance,Exponential,Out);
  auVar15._8_4_ = uStack_b0;
  auVar15._0_4_ = VVar11.x;
  auVar15._4_4_ = VVar11.y;
  auVar15._12_4_ = uStack_ac;
  auVar3._4_4_ = dp_ratio;
  auVar3._0_4_ = dp_ratio;
  auVar3._8_4_ = dp_ratio;
  auVar3._12_4_ = dp_ratio;
  auVar15 = divps(auVar15,auVar3);
  auVar15 = divps(auVar15,_DAT_0031b640);
  VVar11 = Math::Min<Rml::Vector2<float>>(auVar15._0_8_,(Vector2f)0x3f8000003f800000);
  auVar2._8_8_ = extraout_XMM0_Qb_00;
  auVar2._0_4_ = VVar12.x;
  auVar2._4_4_ = VVar12.y;
  auVar15 = divps(auVar2,_DAT_0031b640);
  VVar12 = Math::Min<Rml::Vector2<float>>(auVar15._0_8_,(Vector2f)0x3f8000003f800000);
  local_b8 = VVar12.x;
  fStack_b4 = VVar12.y;
  local_98 = VVar11.x;
  fVar6 = Tween::operator()((Tween *)&scroll_distance,local_98);
  fVar7 = Tween::operator()((Tween *)&scroll_distance,local_b8);
  fStack_94 = VVar11.y;
  fVar8 = Tween::operator()((Tween *)&scroll_distance,fStack_94);
  fVar9 = Tween::operator()((Tween *)&scroll_distance,fStack_b4);
  VVar11.x = local_88 * 0.05 * local_88 + 800.0;
  VVar11.y = fStack_84 * 0.05 * fStack_84 + 800.0;
  VVar11 = Math::Min<Rml::Vector2<float>>(VVar11,(Vector2f)0x461c4000461c4000);
  local_88 = VVar11.x;
  fStack_84 = VVar11.y;
  fVar10 = UpdateTime(this);
  local_68._0_4_ = auVar14._0_4_;
  local_68._4_4_ = auVar14._4_4_;
  local_20.x = fVar10 * this->smoothscroll_speed_factor *
                        (float)(~-(uint)(0.0 < (float)local_68._0_4_) &
                                -(uint)((float)local_68._0_4_ < 0.0) & 0xbf800000 |
                               -(uint)(0.0 < (float)local_68._0_4_) & 0x3f800000) * dp_ratio *
                        (fVar7 * fVar6 * 0.8 + 0.2) * local_88;
  local_20.y = fVar10 * this->smoothscroll_speed_factor *
                        (float)(~-(uint)(0.0 < (float)local_68._4_4_) &
                                -(uint)((float)local_68._4_4_ < 0.0) & 0xbf800000 |
                               -(uint)(0.0 < (float)local_68._4_4_) & 0x3f800000) * dp_ratio *
                        (fVar9 * fVar8 * 0.8 + 0.2) * fStack_84;
  VVar13 = Vector2<float>::Round(&local_20);
  scroll_distance.x = VVar13.x;
  scroll_distance.y = VVar13.y;
  lVar5 = 0;
  do {
    if (lVar5 == 2) {
      VVar12.y = (this->smoothscroll_scrolled_distance).y + scroll_distance.y;
      VVar12.x = (this->smoothscroll_scrolled_distance).x + scroll_distance.x;
      this->smoothscroll_scrolled_distance = VVar12;
      PerformScrollOnTarget(this,scroll_distance);
      bVar4 = HasSmoothscrollReachedTarget(this);
      if (bVar4) {
        this->mode = None;
        this->target = (Element *)0x0;
        (this->autoscroll_start_position).x = 0;
        (this->autoscroll_start_position).y = 0;
        (this->autoscroll_accumulated_length).x = 0.0;
        (this->autoscroll_accumulated_length).y = 0.0;
        this->autoscroll_moved = false;
        (this->smoothscroll_target_distance).x = 0.0;
        (this->smoothscroll_target_distance).y = 0.0;
        (this->smoothscroll_scrolled_distance).x = 0.0;
        (this->smoothscroll_scrolled_distance).y = 0.0;
      }
      return;
    }
    fVar6 = (&target_delta.x)[lVar5];
    if (fVar6 <= 0.0) {
      if (fVar6 < 0.0) {
        fVar7 = (&scroll_distance.x)[lVar5];
        if (-1.0 <= (&scroll_distance.x)[lVar5]) {
          fVar7 = -1.0;
        }
        if (fVar7 <= fVar6) {
          fVar7 = fVar6;
        }
        goto LAB_002c164a;
      }
      (&scroll_distance.x)[lVar5] = 0.0;
    }
    else {
      fVar7 = (&scroll_distance.x)[lVar5];
      if (fVar7 <= 1.0) {
        fVar7 = 1.0;
      }
      if (fVar6 <= fVar7) {
        fVar7 = fVar6;
      }
LAB_002c164a:
      (&scroll_distance.x)[lVar5] = fVar7;
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void ScrollController::UpdateSmoothscroll(float dp_ratio)
{
	RMLUI_ASSERT(mode == Mode::Smoothscroll && target);

	const Vector2f target_delta = Vector2f(smoothscroll_target_distance - smoothscroll_scrolled_distance);
	const Vector2f velocity = CalculateSmoothscrollVelocity(target_delta, smoothscroll_scrolled_distance, dp_ratio);

	const float dt = UpdateTime();
	Vector2f scroll_distance = (smoothscroll_speed_factor * velocity * dt).Round();

	for (int i = 0; i < 2; i++)
	{
		// Ensure minimum scroll speed of 1px/frame, and clamp the distance to the target in case of overshooting
		// integration. As opposed to autoscroll, we don't care about fractional speeds here since we want to be fast.
		if (target_delta[i] > 0.f)
			scroll_distance[i] = Math::Min(Math::Max(scroll_distance[i], 1.f), target_delta[i]);
		else if (target_delta[i] < 0.f)
			scroll_distance[i] = Math::Max(Math::Min(scroll_distance[i], -1.f), target_delta[i]);
		else
			scroll_distance[i] = 0.f;
	}

#if 0
	// Useful debugging output for velocity model tuning.
	Log::Message(Log::LT_INFO, "Scroll  y0 %8.2f   y1 %8.2f   v %8.2f   d %8.2f", smoothscroll_scrolled_distance.y, target_delta.y, velocity.y,
		scroll_distance.y);
#endif

	smoothscroll_scrolled_distance += scroll_distance;
	PerformScrollOnTarget(scroll_distance);

	if (HasSmoothscrollReachedTarget())
		Reset();
}